

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

void nn_pipebase_received(nn_pipebase *self)

{
  uint uVar1;
  void *in_RCX;
  int option;
  int extraout_EDX;
  int option_00;
  size_t __n;
  int in_ESI;
  int socktype;
  ulong uVar2;
  size_t *in_R8;
  int iStack_1c;
  
  if (self->instate == '\x02') {
    self->instate = '\x03';
    return;
  }
  if (self->instate == '\x04') {
    self->instate = '\x01';
    nn_fsm_raise(&self->fsm,&self->in,0x84c3);
    return;
  }
  nn_pipebase_received_cold_1();
  if (self->outstate == '\x02') {
    self->outstate = '\x03';
    return;
  }
  if (self->outstate != '\x04') {
    nn_pipebase_sent_cold_1();
    option_00 = option;
    if (in_ESI != 0) {
      uVar1 = nn_sock_getopt_inner(self->sock,in_ESI,option,in_RCX,in_R8);
      if (uVar1 == 0) {
        return;
      }
      self = (nn_pipebase *)(ulong)uVar1;
      nn_pipebase_getopt_cold_1();
      option_00 = extraout_EDX;
    }
    if (option_00 == 0xe) {
      iStack_1c = (self->options).ipv4only;
    }
    else if (option_00 == 9) {
      iStack_1c = (self->options).rcvprio;
    }
    else {
      if (option_00 != 8) {
        socktype = 0;
        uVar1 = nn_sock_getopt_inner(self->sock,0,option_00,in_RCX,in_R8);
        if (uVar1 == 0) {
          return;
        }
        uVar2 = (ulong)uVar1;
        nn_pipebase_getopt_cold_2();
        nn_sock_ispeer(*(nn_sock **)(uVar2 + 0x68),socktype);
        return;
      }
      iStack_1c = (self->options).sndprio;
    }
    __n = 4;
    if (*in_R8 < 4) {
      __n = *in_R8;
    }
    memcpy(in_RCX,&iStack_1c,__n);
    *in_R8 = 4;
    return;
  }
  self->outstate = '\x01';
  nn_fsm_raise(&self->fsm,&self->out,0x84c4);
  return;
}

Assistant:

void nn_pipebase_received (struct nn_pipebase *self)
{
    if (nn_fast (self->instate == NN_PIPEBASE_INSTATE_RECEIVING)) {
        self->instate = NN_PIPEBASE_INSTATE_RECEIVED;
        return;
    }
    nn_assert (self->instate == NN_PIPEBASE_INSTATE_ASYNC);
    self->instate = NN_PIPEBASE_INSTATE_IDLE;
    nn_fsm_raise (&self->fsm, &self->in, NN_PIPE_IN);
}